

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void I422ToAR30Row_SSSE3(uint8_t *y_buf,uint8_t *u_buf,uint8_t *v_buf,uint8_t *dst_ar30,
                        YuvConstants *yuvconstants,int width)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined4 uVar6;
  undefined4 uVar7;
  bool bVar8;
  unkbyte10 Var9;
  undefined1 auVar10 [12];
  undefined1 auVar11 [14];
  undefined1 auVar12 [12];
  undefined1 auVar13 [14];
  undefined1 auVar14 [12];
  undefined1 auVar15 [14];
  undefined1 auVar16 [15];
  undefined8 uVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  undefined6 uVar42;
  undefined1 auVar43 [12];
  long lVar44;
  int iVar45;
  ushort uVar46;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar57;
  ushort uVar58;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  ushort uVar59;
  undefined1 auVar50 [16];
  ushort uVar61;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  ushort uVar72;
  undefined1 auVar65 [16];
  ushort uVar73;
  int iVar74;
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  undefined1 auVar76 [16];
  ushort uVar80;
  ushort uVar86;
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar96 [16];
  undefined1 auVar98 [12];
  undefined1 in_XMM5 [16];
  undefined1 auVar100 [16];
  int width_local;
  short sVar47;
  undefined2 uVar51;
  short sVar56;
  short sVar60;
  undefined1 auVar75 [12];
  undefined1 auVar78 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 uVar97;
  undefined1 auVar99 [14];
  
  auVar2 = *(undefined1 (*) [16])yuvconstants->kUVToB;
  auVar3 = *(undefined1 (*) [16])yuvconstants->kUVToG;
  auVar4 = *(undefined1 (*) [16])yuvconstants->kUVToR;
  sVar18 = yuvconstants->kUVBiasB[0];
  sVar19 = yuvconstants->kUVBiasB[1];
  sVar20 = yuvconstants->kUVBiasB[2];
  sVar21 = yuvconstants->kUVBiasB[3];
  sVar22 = yuvconstants->kUVBiasB[4];
  sVar23 = yuvconstants->kUVBiasB[5];
  sVar24 = yuvconstants->kUVBiasB[6];
  sVar25 = yuvconstants->kUVBiasB[7];
  sVar26 = yuvconstants->kUVBiasG[0];
  sVar27 = yuvconstants->kUVBiasG[1];
  sVar28 = yuvconstants->kUVBiasG[2];
  sVar29 = yuvconstants->kUVBiasG[3];
  sVar30 = yuvconstants->kUVBiasG[4];
  sVar31 = yuvconstants->kUVBiasG[5];
  sVar32 = yuvconstants->kUVBiasG[6];
  sVar33 = yuvconstants->kUVBiasG[7];
  sVar34 = yuvconstants->kUVBiasR[0];
  sVar35 = yuvconstants->kUVBiasR[1];
  sVar36 = yuvconstants->kUVBiasR[2];
  sVar37 = yuvconstants->kUVBiasR[3];
  sVar38 = yuvconstants->kUVBiasR[4];
  sVar39 = yuvconstants->kUVBiasR[5];
  sVar40 = yuvconstants->kUVBiasR[6];
  sVar41 = yuvconstants->kUVBiasR[7];
  auVar5 = *(undefined1 (*) [16])yuvconstants->kYToRgb;
  lVar44 = (long)v_buf - (long)u_buf;
  auVar16._1_14_ = in_XMM5._2_14_;
  auVar16[0] = 0xff;
  auVar98._0_10_ = CONCAT19(0xff,CONCAT18(0xff,0xff00000000000000));
  auVar98[10] = 0xff;
  auVar98[0xb] = 0xff;
  auVar99[0xc] = 0xff;
  auVar99._0_12_ = auVar98;
  auVar99[0xd] = 0xff;
  auVar100._0_2_ = (ushort)(auVar16._0_2_ << 8) >> 0xe;
  auVar100._2_2_ = 3;
  auVar100._4_2_ = 3;
  auVar100._6_2_ = 3;
  auVar100._8_2_ = (ushort)((unkuint10)auVar98._0_10_ >> 0x4e);
  auVar100._10_2_ = auVar98._10_2_ >> 0xe;
  auVar100._12_2_ = auVar99._12_2_ >> 0xe;
  auVar100._14_2_ = 3;
  auVar100 = psllw(auVar100,4);
  do {
    uVar6 = *(undefined4 *)u_buf;
    uVar7 = *(undefined4 *)(u_buf + lVar44);
    u_buf = u_buf + 4;
    uVar51 = CONCAT11((char)((uint)uVar7 >> 0x18),(char)((uint)uVar6 >> 0x18));
    uVar17 = CONCAT35(CONCAT21(uVar51,(char)((uint)uVar7 >> 0x10)),
                      CONCAT14((char)((uint)uVar6 >> 0x10),uVar6));
    uVar42 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),(char)((uint)uVar7 >> 8)),
                      (char)((uint)uVar6 >> 8));
    auVar64._0_2_ = CONCAT11((char)uVar7,(char)uVar6);
    uVar1 = CONCAT62(uVar42,auVar64._0_2_);
    auVar62._8_4_ = 0;
    auVar62._0_8_ = uVar1;
    auVar62._12_2_ = uVar51;
    auVar62._14_2_ = uVar51;
    uVar51 = (undefined2)((ulong)uVar17 >> 0x20);
    auVar48._12_4_ = auVar62._12_4_;
    auVar48._8_2_ = 0;
    auVar48._0_8_ = uVar1;
    auVar48._10_2_ = uVar51;
    auVar96._10_6_ = auVar48._10_6_;
    auVar96._8_2_ = uVar51;
    auVar96._0_8_ = uVar1;
    uVar51 = (undefined2)uVar42;
    auVar64._8_8_ = auVar96._8_8_;
    auVar64._6_2_ = uVar51;
    auVar64._4_2_ = uVar51;
    auVar64._2_2_ = auVar64._0_2_;
    uVar1 = *(ulong *)y_buf;
    uVar97 = (undefined1)(uVar1 >> 0x38);
    auVar95._8_6_ = 0;
    auVar95._0_8_ = uVar1;
    auVar95[0xe] = uVar97;
    auVar95[0xf] = uVar97;
    uVar97 = (undefined1)(uVar1 >> 0x30);
    auVar94._14_2_ = auVar95._14_2_;
    auVar94._8_5_ = 0;
    auVar94._0_8_ = uVar1;
    auVar94[0xd] = uVar97;
    auVar93._13_3_ = auVar94._13_3_;
    auVar93._8_4_ = 0;
    auVar93._0_8_ = uVar1;
    auVar93[0xc] = uVar97;
    uVar97 = (undefined1)(uVar1 >> 0x28);
    auVar92._12_4_ = auVar93._12_4_;
    auVar92._8_3_ = 0;
    auVar92._0_8_ = uVar1;
    auVar92[0xb] = uVar97;
    auVar91._11_5_ = auVar92._11_5_;
    auVar91._8_2_ = 0;
    auVar91._0_8_ = uVar1;
    auVar91[10] = uVar97;
    uVar97 = (undefined1)(uVar1 >> 0x20);
    auVar90._10_6_ = auVar91._10_6_;
    auVar90[8] = 0;
    auVar90._0_8_ = uVar1;
    auVar90[9] = uVar97;
    auVar89._9_7_ = auVar90._9_7_;
    auVar89[8] = uVar97;
    auVar89._0_8_ = uVar1;
    uVar97 = (undefined1)(uVar1 >> 0x18);
    auVar88._8_8_ = auVar89._8_8_;
    auVar88[7] = uVar97;
    auVar88[6] = uVar97;
    uVar97 = (undefined1)(uVar1 >> 0x10);
    auVar88[5] = uVar97;
    auVar88[4] = uVar97;
    uVar97 = (undefined1)(uVar1 >> 8);
    auVar88[3] = uVar97;
    auVar88[2] = uVar97;
    auVar88[0] = (undefined1)uVar1;
    auVar88[1] = auVar88[0];
    y_buf = (uint8_t *)((long)y_buf + 8);
    auVar62 = pmaddubsw(auVar64,auVar2);
    auVar49._0_2_ = sVar18 - auVar62._0_2_;
    auVar49._2_2_ = sVar19 - auVar62._2_2_;
    auVar49._4_2_ = sVar20 - auVar62._4_2_;
    auVar49._6_2_ = sVar21 - auVar62._6_2_;
    auVar49._8_2_ = sVar22 - auVar62._8_2_;
    auVar49._10_2_ = sVar23 - auVar62._10_2_;
    auVar49._12_2_ = sVar24 - auVar62._12_2_;
    auVar49._14_2_ = sVar25 - auVar62._14_2_;
    auVar62 = pmaddubsw(auVar64,auVar3);
    auVar63._0_2_ = sVar26 - auVar62._0_2_;
    auVar63._2_2_ = sVar27 - auVar62._2_2_;
    auVar63._4_2_ = sVar28 - auVar62._4_2_;
    auVar63._6_2_ = sVar29 - auVar62._6_2_;
    auVar63._8_2_ = sVar30 - auVar62._8_2_;
    auVar63._10_2_ = sVar31 - auVar62._10_2_;
    auVar63._12_2_ = sVar32 - auVar62._12_2_;
    auVar63._14_2_ = sVar33 - auVar62._14_2_;
    auVar62 = pmaddubsw(auVar64,auVar4);
    auVar76._0_2_ = sVar34 - auVar62._0_2_;
    auVar76._2_2_ = sVar35 - auVar62._2_2_;
    auVar76._4_2_ = sVar36 - auVar62._4_2_;
    auVar76._6_2_ = sVar37 - auVar62._6_2_;
    auVar76._8_2_ = sVar38 - auVar62._8_2_;
    auVar76._10_2_ = sVar39 - auVar62._10_2_;
    auVar76._12_2_ = sVar40 - auVar62._12_2_;
    auVar76._14_2_ = sVar41 - auVar62._14_2_;
    auVar96 = pmulhuw(auVar88,auVar5);
    auVar62 = paddsw(auVar49,auVar96);
    auVar64 = paddsw(auVar63,auVar96);
    auVar96 = paddsw(auVar76,auVar96);
    auVar62 = psraw(auVar62,4);
    auVar64 = psraw(auVar64,4);
    auVar96 = psraw(auVar96,4);
    Var9 = CONCAT19(3,CONCAT18(0xff,0x3ff03ff03ff03ff));
    auVar10[10] = 0xff;
    auVar10._0_10_ = Var9;
    auVar10[0xb] = 3;
    auVar11[0xc] = 0xff;
    auVar11._0_12_ = auVar10;
    auVar11[0xd] = 3;
    sVar47 = auVar62._0_2_;
    uVar46 = (ushort)(0x3ff < sVar47) * 0x3ff | (ushort)(0x3ff >= sVar47) * sVar47;
    sVar47 = auVar62._2_2_;
    uVar52 = (ushort)(0x3ff < sVar47) * 0x3ff | (ushort)(0x3ff >= sVar47) * sVar47;
    sVar47 = auVar62._4_2_;
    uVar53 = (ushort)(0x3ff < sVar47) * 0x3ff | (ushort)(0x3ff >= sVar47) * sVar47;
    sVar47 = auVar62._6_2_;
    uVar54 = (ushort)(0x3ff < sVar47) * 0x3ff | (ushort)(0x3ff >= sVar47) * sVar47;
    sVar47 = (short)((unkuint10)Var9 >> 0x40);
    sVar56 = auVar62._8_2_;
    uVar55 = (ushort)(sVar47 < sVar56) * sVar47 | (ushort)(sVar47 >= sVar56) * sVar56;
    sVar47 = auVar10._10_2_;
    sVar56 = auVar62._10_2_;
    uVar57 = (ushort)(sVar47 < sVar56) * sVar47 | (ushort)(sVar47 >= sVar56) * sVar56;
    sVar47 = auVar11._12_2_;
    sVar56 = auVar62._12_2_;
    sVar60 = auVar62._14_2_;
    uVar58 = (ushort)(sVar47 < sVar56) * sVar47 | (ushort)(sVar47 >= sVar56) * sVar56;
    uVar59 = (ushort)(0x3ff < sVar60) * 0x3ff | (ushort)(0x3ff >= sVar60) * sVar60;
    Var9 = CONCAT19(3,CONCAT18(0xff,0x3ff03ff03ff03ff));
    auVar12[10] = 0xff;
    auVar12._0_10_ = Var9;
    auVar12[0xb] = 3;
    auVar13[0xc] = 0xff;
    auVar13._0_12_ = auVar12;
    auVar13[0xd] = 3;
    sVar47 = auVar64._0_2_;
    uVar61 = (ushort)(0x3ff < sVar47) * 0x3ff | (ushort)(0x3ff >= sVar47) * sVar47;
    sVar47 = auVar64._2_2_;
    uVar66 = (ushort)(0x3ff < sVar47) * 0x3ff | (ushort)(0x3ff >= sVar47) * sVar47;
    sVar47 = auVar64._4_2_;
    uVar67 = (ushort)(0x3ff < sVar47) * 0x3ff | (ushort)(0x3ff >= sVar47) * sVar47;
    sVar47 = auVar64._6_2_;
    uVar68 = (ushort)(0x3ff < sVar47) * 0x3ff | (ushort)(0x3ff >= sVar47) * sVar47;
    sVar47 = (short)((unkuint10)Var9 >> 0x40);
    sVar56 = auVar64._8_2_;
    uVar69 = (ushort)(sVar47 < sVar56) * sVar47 | (ushort)(sVar47 >= sVar56) * sVar56;
    sVar47 = auVar12._10_2_;
    sVar56 = auVar64._10_2_;
    uVar70 = (ushort)(sVar47 < sVar56) * sVar47 | (ushort)(sVar47 >= sVar56) * sVar56;
    sVar47 = auVar13._12_2_;
    sVar56 = auVar64._12_2_;
    sVar60 = auVar64._14_2_;
    uVar71 = (ushort)(sVar47 < sVar56) * sVar47 | (ushort)(sVar47 >= sVar56) * sVar56;
    uVar72 = (ushort)(0x3ff < sVar60) * 0x3ff | (ushort)(0x3ff >= sVar60) * sVar60;
    Var9 = CONCAT19(3,CONCAT18(0xff,0x3ff03ff03ff03ff));
    auVar14[10] = 0xff;
    auVar14._0_10_ = Var9;
    auVar14[0xb] = 3;
    auVar15[0xc] = 0xff;
    auVar15._0_12_ = auVar14;
    auVar15[0xd] = 3;
    sVar47 = auVar96._0_2_;
    uVar73 = (ushort)(0x3ff < sVar47) * 0x3ff | (ushort)(0x3ff >= sVar47) * sVar47;
    sVar47 = auVar96._2_2_;
    uVar80 = (ushort)(0x3ff < sVar47) * 0x3ff | (ushort)(0x3ff >= sVar47) * sVar47;
    sVar47 = auVar96._4_2_;
    uVar81 = (ushort)(0x3ff < sVar47) * 0x3ff | (ushort)(0x3ff >= sVar47) * sVar47;
    sVar47 = auVar96._6_2_;
    uVar82 = (ushort)(0x3ff < sVar47) * 0x3ff | (ushort)(0x3ff >= sVar47) * sVar47;
    sVar47 = (short)((unkuint10)Var9 >> 0x40);
    sVar56 = auVar96._8_2_;
    uVar83 = (ushort)(sVar47 < sVar56) * sVar47 | (ushort)(sVar47 >= sVar56) * sVar56;
    sVar47 = auVar14._10_2_;
    sVar56 = auVar96._10_2_;
    uVar84 = (ushort)(sVar47 < sVar56) * sVar47 | (ushort)(sVar47 >= sVar56) * sVar56;
    sVar47 = auVar15._12_2_;
    sVar56 = auVar96._12_2_;
    sVar60 = auVar96._14_2_;
    uVar85 = (ushort)(sVar47 < sVar56) * sVar47 | (ushort)(sVar47 >= sVar56) * sVar56;
    uVar86 = (ushort)(0x3ff < sVar60) * 0x3ff | (ushort)(0x3ff >= sVar60) * sVar60;
    sVar47 = (-1 < (short)uVar54) * uVar54;
    sVar56 = (-1 < (short)uVar68) * uVar68;
    auVar77._2_2_ = (-1 < (short)uVar80) * uVar80;
    auVar77._0_2_ = (-1 < (short)uVar73) * uVar73;
    auVar77._4_2_ = (-1 < (short)uVar81) * uVar81;
    auVar77._6_2_ = (-1 < (short)uVar82) * uVar82;
    auVar77._8_2_ = (-1 < (short)uVar83) * uVar83;
    auVar77._10_2_ = (-1 < (short)uVar84) * uVar84;
    auVar77._12_2_ = (-1 < (short)uVar85) * uVar85;
    auVar77._14_2_ = (-1 < (short)uVar86) * uVar86;
    auVar62 = psllw(auVar77,4);
    auVar50._8_8_ =
         (undefined8)
         (CONCAT64(CONCAT42(CONCAT22(auVar62._6_2_,sVar47),auVar62._4_2_),
                   CONCAT22((-1 < (short)uVar53) * uVar53,sVar47)) >> 0x10);
    auVar50._6_2_ = auVar62._2_2_;
    auVar50._4_2_ = (-1 < (short)uVar52) * uVar52;
    auVar50._2_2_ = auVar62._0_2_;
    auVar50._0_2_ = (-1 < (short)uVar46) * uVar46;
    auVar87._2_2_ = auVar62._8_2_;
    auVar87._0_2_ = (-1 < (short)uVar55) * uVar55;
    auVar87._4_2_ = (-1 < (short)uVar57) * uVar57;
    auVar87._6_2_ = auVar62._10_2_;
    auVar87._8_2_ = (-1 < (short)uVar58) * uVar58;
    auVar87._10_2_ = auVar62._12_2_;
    auVar87._12_2_ = (-1 < (short)uVar59) * uVar59;
    auVar87._14_2_ = auVar62._14_2_;
    iVar45 = CONCAT22(auVar100._6_2_,sVar56);
    Var9 = CONCAT64(CONCAT42(iVar45,auVar100._4_2_),CONCAT22((-1 < (short)uVar67) * uVar67,sVar56));
    auVar43._4_8_ = (long)((unkuint10)Var9 >> 0x10);
    auVar43._2_2_ = auVar100._2_2_;
    auVar43._0_2_ = (-1 < (short)uVar66) * uVar66;
    iVar74 = CONCAT22(auVar100._8_2_,(-1 < (short)uVar69) * uVar69);
    auVar75._0_8_ = CONCAT26(auVar100._10_2_,CONCAT24((-1 < (short)uVar70) * uVar70,iVar74));
    auVar75._8_2_ = (-1 < (short)uVar71) * uVar71;
    auVar75._10_2_ = auVar100._12_2_;
    auVar78._12_2_ = (-1 < (short)uVar72) * uVar72;
    auVar78._0_12_ = auVar75;
    auVar78._14_2_ = auVar100._14_2_;
    auVar65._0_4_ = CONCAT22(auVar100._0_2_,(-1 < (short)uVar61) * uVar61) << 10;
    auVar65._4_4_ = auVar43._0_4_ << 10;
    auVar65._8_4_ = (int)((unkuint10)Var9 >> 0x10) << 10;
    auVar65._12_4_ = iVar45 << 10;
    auVar79._0_4_ = iVar74 << 10;
    auVar79._4_4_ = (int)((ulong)auVar75._0_8_ >> 0x20) << 10;
    auVar79._8_4_ = auVar75._8_4_ << 10;
    auVar79._12_4_ = auVar78._12_4_ << 10;
    *(undefined1 (*) [16])dst_ar30 = auVar50 | auVar65;
    *(undefined1 (*) [16])((long)dst_ar30 + 0x10) = auVar87 | auVar79;
    dst_ar30 = (uint8_t *)((long)dst_ar30 + 0x20);
    iVar45 = width + -8;
    bVar8 = 7 < width;
    width = iVar45;
  } while (iVar45 != 0 && bVar8);
  return;
}

Assistant:

void OMITFP I422ToAR30Row_SSSE3(const uint8_t* y_buf,
                                const uint8_t* u_buf,
                                const uint8_t* v_buf,
                                uint8_t* dst_ar30,
                                const struct YuvConstants* yuvconstants,
                                int width) {
  asm volatile (
    YUVTORGB_SETUP(yuvconstants)
      "sub         %[u_buf],%[v_buf]             \n"
      "pcmpeqb     %%xmm5,%%xmm5                 \n"  // AR30 constants
      "psrlw       $14,%%xmm5                    \n"
      "psllw       $4,%%xmm5                     \n"  // 2 alpha bits
      "pxor        %%xmm6,%%xmm6                 \n"
      "pcmpeqb     %%xmm7,%%xmm7                 \n"  // 0 for min
      "psrlw       $6,%%xmm7                     \n"  // 1023 for max

    LABELALIGN
      "1:                                        \n"
    READYUV422
    YUVTORGB16(yuvconstants)
    STOREAR30
      "sub         $0x8,%[width]                 \n"
      "jg          1b                            \n"
  : [y_buf]"+r"(y_buf),    // %[y_buf]
    [u_buf]"+r"(u_buf),    // %[u_buf]
    [v_buf]"+r"(v_buf),    // %[v_buf]
    [dst_ar30]"+r"(dst_ar30),  // %[dst_ar30]
    [width]"+rm"(width)    // %[width]
  : [yuvconstants]"r"(yuvconstants)  // %[yuvconstants]
  : "memory", "cc", YUVTORGB_REGS
    "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6", "xmm7"
  );
}